

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall gl4cts::GPUShaderFP64Test3::deinit(GPUShaderFP64Test3 *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  programInfo::deinit(&this->m_packed_program,(this->super_TestCase).m_context);
  programInfo::deinit(&this->m_shared_program,(this->super_TestCase).m_context);
  programInfo::deinit(&this->m_std140_program,(this->super_TestCase).m_context);
  if (this->m_framebuffer_id != 0) {
    (**(code **)(lVar2 + 0x78))(0x8ca9,0);
    (**(code **)(lVar2 + 0x440))(1,&this->m_framebuffer_id);
    this->m_framebuffer_id = 0;
  }
  if (this->m_color_texture_id != 0) {
    (**(code **)(lVar2 + 0xb8))(0xde1,0);
    (**(code **)(lVar2 + 0x480))(1,&this->m_color_texture_id);
    this->m_color_texture_id = 0;
  }
  if (this->m_transform_feedback_buffer_id != 0) {
    (**(code **)(lVar2 + 0x40))(0x8c8e,0);
    (**(code **)(lVar2 + 0x438))(1,&this->m_transform_feedback_buffer_id);
    this->m_transform_feedback_buffer_id = 0;
  }
  if (this->m_uniform_buffer_id != 0) {
    (**(code **)(lVar2 + 0x40))(0x8a11,0);
    (**(code **)(lVar2 + 0x438))(1,&this->m_uniform_buffer_id);
    this->m_uniform_buffer_id = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar2 + 0xd8))(0);
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  return;
}

Assistant:

void GPUShaderFP64Test3::deinit()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean programs */
	m_packed_program.deinit(m_context);
	m_shared_program.deinit(m_context);
	m_std140_program.deinit(m_context);

	/* Clean frambuffer */
	if (0 != m_framebuffer_id)
	{
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.deleteFramebuffers(1, &m_framebuffer_id);

		m_framebuffer_id = 0;
	}

	/* Clean texture */
	if (0 != m_color_texture_id)
	{
		gl.bindTexture(GL_TEXTURE_2D, 0);
		gl.deleteTextures(1, &m_color_texture_id);

		m_color_texture_id = 0;
	}

	/* Clean buffers */
	if (0 != m_transform_feedback_buffer_id)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.deleteBuffers(1, &m_transform_feedback_buffer_id);

		m_transform_feedback_buffer_id = 0;
	}

	if (0 != m_uniform_buffer_id)
	{
		gl.bindBuffer(GL_UNIFORM_BUFFER, 0);
		gl.deleteBuffers(1, &m_uniform_buffer_id);

		m_uniform_buffer_id = 0;
	}

	/* Clean VAO */
	if (0 != m_vertex_array_object_id)
	{
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);

		m_vertex_array_object_id = 0;
	}
}